

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O2

void __thiscall
fe::operations::op_blend_one_invSrcAlpha::operator()
          (op_blend_one_invSrcAlpha *this,PixelDISTANCE *srcPixelFormat,PixelA8 *destPixelFormat,
          uchar *srcData,uchar *destData,int x,int y)

{
  uchar uVar1;
  uint uVar2;
  undefined8 in_RAX;
  Pixel s;
  Pixel local_14;
  
  local_14.field_0.field_0.bytes[3] = (uchar)((ulong)in_RAX >> 0x38);
  PixelDISTANCE::getPixel(srcPixelFormat,srcData,&local_14,x,y);
  uVar2 = ((uint)(byte)~local_14.field_0.field_0.bytes[3] * (uint)*destData) / 0xff +
          (uint)local_14.field_0.field_0.bytes[3];
  uVar1 = (uchar)uVar2;
  if (0xfe < uVar2) {
    uVar1 = 0xff;
  }
  *destData = uVar1;
  return;
}

Assistant:

void operator()(const Src& srcPixelFormat, Dest& destPixelFormat, const unsigned char* srcData, unsigned char* destData, OPERATOR_ARGS) const
            {
                Pixel s;
                srcPixelFormat.getPixel(srcData, s, OPERATOR_ARGS_PASS);

                Pixel d;
                destPixelFormat.getPixel(destData, d, OPERATOR_ARGS_PASS);

#define M(v) v < 255 ? v : 255;
                unsigned char ia = 255 - s.a;
                Pixel r;
                r.r = M((d.r * ia) / 255 + s.r);
                r.g = M((d.g * ia) / 255 + s.g);
                r.b = M((d.b * ia) / 255 + s.b);
                r.a = M((d.a * ia) / 255 + s.a);
#undef  M

                destPixelFormat.setPixel(destData, r);
            }